

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O0

void __thiscall
btLemkeAlgorithm::GaussJordanEliminationStep
          (btLemkeAlgorithm *this,btMatrixXf *A,int pivotRowIndex,int pivotColumnIndex,
          btAlignedObjectArray<int> *basis)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  btMatrixX<float> *in_RSI;
  int i_2;
  int i_1;
  btScalar v;
  int j;
  int i;
  btScalar a;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  
  btMatrixX<float>::operator()
            ((btMatrixX<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  for (local_28 = 0; iVar1 = btMatrixX<float>::rows(in_RSI), local_28 < iVar1;
      local_28 = local_28 + 1) {
    if (local_28 != in_EDX) {
      for (local_2c = 0; iVar1 = btMatrixX<float>::cols(in_RSI), local_2c < iVar1;
          local_2c = local_2c + 1) {
        if (local_2c != in_ECX) {
          btMatrixX<float>::operator()
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          btMatrixX<float>::operator()
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          btMatrixX<float>::operator()
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          btMatrixX<float>::setElem
                    ((btMatrixX<float> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0.0);
        }
      }
    }
  }
  for (local_34 = 0; iVar1 = btMatrixX<float>::cols(in_RSI), local_34 < iVar1;
      local_34 = local_34 + 1) {
    btMatrixX<float>::mulElem
              ((btMatrixX<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0.0);
  }
  local_38 = 0;
  while (iVar1 = local_38, iVar2 = btMatrixX<float>::rows(in_RSI), iVar1 < iVar2) {
    if (local_38 != in_EDX) {
      btMatrixX<float>::setElem
                ((btMatrixX<float> *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0.0);
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void btLemkeAlgorithm::GaussJordanEliminationStep(btMatrixXu& A, int pivotRowIndex, int pivotColumnIndex, const btAlignedObjectArray<int>& basis) 
{

	btScalar a = -1 / A(pivotRowIndex, pivotColumnIndex);
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif

    for (int i = 0; i < A.rows(); i++)
	{
      if (i != pivotRowIndex)
	  {
        for (int j = 0; j < A.cols(); j++)
		{
          if (j != pivotColumnIndex)
		  {
			  btScalar v = A(i, j);
			  v += A(pivotRowIndex, j) * A(i, pivotColumnIndex) * a;
            A.setElem(i, j, v);
		  }
		}
	  }
	}

#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //BT_DEBUG_OSTREAM
    for (int i = 0; i < A.cols(); i++) 
	{
      A.mulElem(pivotRowIndex, i,-a);
    }
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //#ifdef BT_DEBUG_OSTREAM

    for (int i = 0; i < A.rows(); i++)
	{
      if (i != pivotRowIndex)
	  {
        A.setElem(i, pivotColumnIndex,0);
	  }
	}
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //#ifdef BT_DEBUG_OSTREAM
  }